

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall Extension::SetDataSize(Extension *this)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t local_28;
  size_t cbCritical;
  Extension *this_local;
  
  bVar1 = Boolean::GetValue(&this->critical);
  if (bVar1) {
    local_28 = DerBase::EncodedSize(&(this->critical).super_DerBase);
  }
  else {
    local_28 = 0;
  }
  sVar2 = DerBase::EncodedSize(&(this->extnID).super_DerBase);
  sVar3 = DerBase::EncodedSize(&(this->extnValue).super_DerBase);
  (this->super_DerBase).cbData = sVar2 + local_28 + sVar3;
  return (this->super_DerBase).cbData;
}

Assistant:

virtual size_t SetDataSize() override
	{
		size_t cbCritical = critical.GetValue() ? critical.EncodedSize() : 0;
		cbData = extnID.EncodedSize() + cbCritical + extnValue.EncodedSize();
		return cbData;
	}